

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hr.cc
# Opt level: O2

size_t __thiscall OB::Hr::term_width(Hr *this,bool is_term)

{
  size_t local_18;
  size_t width;
  
  if (this->width_ != 0) {
    return this->width_;
  }
  if (is_term) {
    local_18 = 0;
    Term::width(&local_18,1);
    return local_18;
  }
  return this->width_default_;
}

Assistant:

std::size_t Hr::term_width(bool const is_term) const
{
  if (width_ > 0)
  {
    return width_;
  }

  if (is_term)
  {
    std::size_t width {0};
    OB::Term::width(width);

    return width;
  }

  return width_default_;
}